

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O2

uint Engine::getRestartLimit(uint i)

{
  byte bVar1;
  uint uVar2;
  double dVar3;
  
  uVar2 = so.restart_scale;
  switch(so.restart_type) {
  case NONE:
    if (i < 2) {
      return 0xffffffff;
    }
    fprintf(_stderr,"%s:%d: ","engine.cpp",0x218);
    fwrite("A restart occurred while using search without restarts",0x36,1,_stderr);
    abort();
  case CONSTANT:
    return so.restart_scale;
  case LINEAR:
    break;
  case LUBY:
    while( true ) {
      bVar1 = 0;
      if (i != 1) {
        bVar1 = 0;
        do {
          bVar1 = bVar1 + 1;
        } while (1 < i >> (bVar1 & 0x1f));
      }
      if ((-1 << (bVar1 + 1 & 0x1f) ^ i) == 0xffffffff) break;
      i = i + (-1 << (bVar1 & 0x1f)) + 1;
    }
    i = (uint)(1L << (bVar1 & 0x3f));
    break;
  case GEOMETRIC:
    dVar3 = pow(so.restart_base,(double)i);
    return (int)dVar3 * uVar2;
  default:
    uVar2 = i + 1 >> 1;
    i = (~uVar2 & uVar2 - 1) + 1;
  }
  return i * so.restart_scale;
}

Assistant:

unsigned int Engine::getRestartLimit(unsigned int i) {
	switch (so.restart_type) {
		case NONE:
			if (i > 1) {
				CHUFFED_ERROR("A restart occurred while using search without restarts");
			}
			return UINT_MAX;
		case CONSTANT:
			return so.restart_scale;
		case LINEAR:
			return i * so.restart_scale;
		case LUBY:
			while (true) {
				unsigned int exp = 0U;
				if (i != 1U) {
					while ((i >> (++exp)) > 1U) {
					}
				}
				if (i == (1U << (exp + 1)) - 1) {
					return static_cast<int>(1UL << exp) * so.restart_scale;
				}
				i = i - (1U << exp) + 1;
			}
		case GEOMETRIC:
			return so.restart_scale * ((int)pow(so.restart_base, i));
		default:
			i = (i + 1) / 2;
			return (((i - 1) & ~i) + 1) * so.restart_scale;
	}
	NEVER;
}